

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

timestamp_t __thiscall
duckdb::TimeBucket::OriginTernaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
          (OriginTernaryOperator *this,interval_t bucket_width,timestamp_t ts,timestamp_t origin,
          ValidityMask *mask,idx_t idx)

{
  bool bVar1;
  BucketWidthType BVar2;
  timestamp_t tVar3;
  NotImplementedException *this_00;
  int64_t extraout_RDX;
  interval_t bucket_width_00;
  allocator local_51;
  string local_50 [32];
  
  bucket_width_00._0_8_ = bucket_width._0_8_;
  tVar3.value = origin.value;
  bVar1 = duckdb::Value::IsFinite<duckdb::timestamp_t>(ts);
  if (!bVar1) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              ((TemplatedValidityMask<unsigned_long> *)origin.value,(idx_t)mask);
    return (timestamp_t)0;
  }
  bucket_width_00.micros = extraout_RDX;
  BVar2 = ClassifyBucketWidthErrorThrow((TimeBucket *)this,bucket_width_00);
  if (BVar2 != CONVERTIBLE_TO_MONTHS) {
    if (BVar2 == CONVERTIBLE_TO_MICROS) {
      tVar3 = OriginWidthConvertibleToMicrosTernaryOperator::
              Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
                        ((OriginWidthConvertibleToMicrosTernaryOperator *)this,bucket_width,ts,tVar3
                        );
      return (timestamp_t)tVar3.value;
    }
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string(local_50,"Bucket type not implemented for TIME_BUCKET",&local_51);
    duckdb::NotImplementedException::NotImplementedException(this_00,local_50);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
  }
  tVar3 = OriginWidthConvertibleToMonthsTernaryOperator::
          Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
                    ((OriginWidthConvertibleToMonthsTernaryOperator *)this,bucket_width,ts,tVar3);
  return (timestamp_t)tVar3.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC origin, ValidityMask &mask, idx_t idx) {
			if (!Value::IsFinite(origin)) {
				mask.SetInvalid(idx);
				return TR();
			}
			BucketWidthType bucket_width_type = ClassifyBucketWidthErrorThrow(bucket_width);
			switch (bucket_width_type) {
			case BucketWidthType::CONVERTIBLE_TO_MICROS:
				return OriginWidthConvertibleToMicrosTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                origin);
			case BucketWidthType::CONVERTIBLE_TO_MONTHS:
				return OriginWidthConvertibleToMonthsTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                origin);
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}